

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Array * json::Json::createArray(Array *__return_storage_ptr__,Node *A)

{
  pointer pNVar1;
  undefined8 uVar2;
  
  (__return_storage_ptr__->super_Type)._vptr_Type = (_func_int **)&PTR_clone_00128cd0;
  (__return_storage_ptr__->fields).
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->fields).
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->fields).
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar1 = (A->production).nodes.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(A->production).nodes.
                         super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pNVar1 >> 5) *
                 -0x5555555555555555)) {
    nextValue(__return_storage_ptr__,pNVar1 + 1);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
  (__return_storage_ptr__->super_Type)._vptr_Type = (_func_int **)&PTR_clone_00128cd0;
  std::vector<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>::
  ~vector(&__return_storage_ptr__->fields);
  _Unwind_Resume(uVar2);
}

Assistant:

static Array createArray(parser::Node const& A) {
            Array array;
            parser::Node const& VS = A.getProduction().nodes.at(1);
            nextValue(array, VS);
            return array;
        }